

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

void __thiscall
Assimp::ASEImporter::ConvertMeshes
          (ASEImporter *this,Mesh *mesh,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *avOutMeshes)

{
  allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *this_00;
  uint uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *pvVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar11;
  float fVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar13;
  bool bVar14;
  size_type sVar15;
  Logger *pLVar16;
  reference pvVar17;
  ulong uVar18;
  size_type *psVar19;
  reference pvVar20;
  aiMesh *paVar21;
  ulong *puVar22;
  aiVector3t<float> *paVar23;
  reference pvVar24;
  pair<unsigned_int,_float> pVar25;
  reference pvVar26;
  undefined8 *puVar27;
  reference pvVar28;
  reference ppVar29;
  aiColor4t<float> *paVar30;
  reference pvVar31;
  pointer ppVar32;
  string *psVar33;
  aiVertexWeight *paVar34;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  aiVector3D *paVar35;
  aiColor4D *paVar36;
  uint *puVar37;
  reference pBVar38;
  reference pvVar39;
  aiBone **ppaVar40;
  aiBone *this_03;
  reference __src;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *pvVar41;
  aiFace *paVar42;
  ulong uVar43;
  ulong uVar44;
  aiVertexWeight *local_540;
  aiColor4t<float> *local_4c0;
  aiVector3t<float> *local_488;
  aiVector3t<float> *local_450;
  aiVector3t<float> *local_418;
  aiFace *local_3f0;
  aiVertexWeight *local_380;
  aiColor4t<float> *local_320;
  aiVector3t<float> *local_2e8;
  aiVector3t<float> *local_290;
  aiVector3t<float> *local_268;
  aiFace *local_240;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *local_210;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1a0;
  aiBone *pc_1;
  aiBone **ppaStack_150;
  uint jfkennedy_1;
  aiBone **pcBone_1;
  uint local_140;
  uint jfkennedy;
  aiVertexWeight weight;
  __normal_iterator<const_std::pair<int,_float>_*,_std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>_>
  local_130;
  const_iterator ronaldweasley;
  __normal_iterator<Assimp::ASE::BoneVertex_*,_std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>_>
  local_120;
  __normal_iterator<const_Assimp::ASE::BoneVertex_*,_std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>_>
  local_118;
  const_iterator harrypotter;
  uint quak;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  avBonesOut;
  uint iFace;
  uint c_1;
  aiMesh *p_pcOut_1;
  pair<unsigned_int,_float> *ref;
  pair<unsigned_int,_float> pStack_d0;
  uint captainkirk;
  aiBone *pc;
  pointer ppStack_c0;
  uint mrspock_1;
  aiBone **pcBone;
  uint mrspock;
  uint t_2;
  uint q_2;
  uint t_1;
  uint q_1;
  uint c;
  __normal_iterator<std::pair<int,_float>_*,_std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>_>
  local_98;
  __normal_iterator<std::pair<int,_float>_*,_std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>_>
  local_90;
  __normal_iterator<const_std::pair<int,_float>_*,_std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>_>
  local_88;
  const_iterator blubb;
  uint local_78;
  uint32_t iIndex2;
  uint t;
  uint q;
  uint iIndex;
  uint iBase;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *avOutputBones;
  aiMesh *p_pcOut;
  value_type_conflict4 local_50;
  uint p;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *aiSplit;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> vSubMaterials;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *avOutMeshes_local;
  Mesh *mesh_local;
  ASEImporter *this_local;
  
  uVar1 = mesh->iMaterialIndex;
  vSubMaterials.super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)avOutMeshes;
  sVar15 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::size
                     (&this->mParser->m_vMaterials);
  if (sVar15 <= uVar1) {
    sVar15 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::size
                       (&this->mParser->m_vMaterials);
    mesh->iMaterialIndex = (int)sVar15 - 1;
    pLVar16 = DefaultLogger::get();
    Logger::warn(pLVar16,"Material index is out of range");
  }
  pvVar17 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::operator[]
                      (&this->mParser->m_vMaterials,(ulong)mesh->iMaterialIndex);
  bVar14 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::empty
                     (&pvVar17->avSubMaterials);
  if (bVar14) {
    paVar21 = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(paVar21);
    paVar21->mPrimitiveTypes = 4;
    paVar21->mMaterialIndex = 0xffffffff;
    _iFace = paVar21;
    pvVar17 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::operator[]
                        (&this->mParser->m_vMaterials,(ulong)mesh->iMaterialIndex);
    pvVar17->bNeed = true;
    _iFace->mColors[3] = (aiColor4D *)(ulong)mesh->iMaterialIndex;
    _iFace->mColors[2] = (aiColor4D *)mesh;
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
               vSubMaterials.
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&iFace);
    bVar14 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::empty
                       (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces);
    if ((!bVar14) &&
       (bVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)mesh),
       !bVar14)) {
      sVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)mesh);
      _iFace->mNumVertices = (uint)sVar15;
      sVar15 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::size
                         (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces);
      _iFace->mNumFaces = (uint)sVar15;
      uVar18 = CONCAT44(0,_iFace->mNumFaces);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar18;
      uVar43 = SUB168(auVar5 * ZEXT816(0x10),0);
      uVar44 = uVar43 + 8;
      if (SUB168(auVar5 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar43) {
        uVar44 = 0xffffffffffffffff;
      }
      puVar22 = (ulong *)operator_new__(uVar44);
      *puVar22 = uVar18;
      paVar42 = (aiFace *)(puVar22 + 1);
      if (uVar18 != 0) {
        local_3f0 = paVar42;
        do {
          aiFace::aiFace(local_3f0);
          local_3f0 = local_3f0 + 1;
        } while (local_3f0 != paVar42 + uVar18);
      }
      _iFace->mFaces = paVar42;
      sVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)mesh);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = sVar15;
      uVar18 = SUB168(auVar6 * ZEXT816(0xc),0);
      if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
        uVar18 = 0xffffffffffffffff;
      }
      paVar35 = (aiVector3D *)operator_new__(uVar18);
      if (sVar15 != 0) {
        local_418 = paVar35;
        do {
          aiVector3t<float>::aiVector3t(local_418);
          local_418 = local_418 + 1;
        } while (local_418 != paVar35 + sVar15);
      }
      _iFace->mVertices = paVar35;
      paVar35 = _iFace->mVertices;
      pvVar26 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)mesh,0)
      ;
      sVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)mesh);
      memcpy(paVar35,pvVar26,sVar15 * 0xc);
      sVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = sVar15;
      uVar18 = SUB168(auVar7 * ZEXT816(0xc),0);
      if (SUB168(auVar7 * ZEXT816(0xc),8) != 0) {
        uVar18 = 0xffffffffffffffff;
      }
      paVar35 = (aiVector3D *)operator_new__(uVar18);
      if (sVar15 != 0) {
        local_450 = paVar35;
        do {
          aiVector3t<float>::aiVector3t(local_450);
          local_450 = local_450 + 1;
        } while (local_450 != paVar35 + sVar15);
      }
      _iFace->mNormals = paVar35;
      paVar35 = _iFace->mNormals;
      pvVar26 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                          (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals,0);
      sVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals);
      memcpy(paVar35,pvVar26,sVar15 * 0xc);
      for (avBonesOut.
           super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          avBonesOut.
          super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 8;
          avBonesOut.
          super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               avBonesOut.
               super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        bVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                           (mesh->amTexCoords +
                            avBonesOut.
                            super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        if (!bVar14) {
          sVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                             (mesh->amTexCoords +
                              avBonesOut.
                              super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = sVar15;
          uVar18 = SUB168(auVar8 * ZEXT816(0xc),0);
          if (SUB168(auVar8 * ZEXT816(0xc),8) != 0) {
            uVar18 = 0xffffffffffffffff;
          }
          paVar35 = (aiVector3D *)operator_new__(uVar18);
          if (sVar15 != 0) {
            local_488 = paVar35;
            do {
              aiVector3t<float>::aiVector3t(local_488);
              local_488 = local_488 + 1;
            } while (local_488 != paVar35 + sVar15);
          }
          _iFace->mTextureCoords
          [avBonesOut.
           super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] = paVar35;
          paVar35 = _iFace->mTextureCoords
                    [avBonesOut.
                     super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_];
          pvVar26 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              (mesh->amTexCoords +
                               avBonesOut.
                               super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0);
          sVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                             (mesh->amTexCoords +
                              avBonesOut.
                              super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          memcpy(paVar35,pvVar26,sVar15 * 0xc);
          _iFace->mNumUVComponents
          [avBonesOut.
           super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] =
               mesh->mNumUVComponents
               [avBonesOut.
                super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_];
        }
      }
      bVar14 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::empty
                         (&mesh->mVertexColors);
      if (!bVar14) {
        sVar15 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                           (&mesh->mVertexColors);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = sVar15;
        uVar18 = SUB168(auVar9 * ZEXT816(0x10),0);
        if (SUB168(auVar9 * ZEXT816(0x10),8) != 0) {
          uVar18 = 0xffffffffffffffff;
        }
        paVar36 = (aiColor4D *)operator_new__(uVar18);
        if (sVar15 != 0) {
          local_4c0 = paVar36;
          do {
            aiColor4t<float>::aiColor4t(local_4c0);
            local_4c0 = local_4c0 + 1;
          } while (local_4c0 != paVar36 + sVar15);
        }
        _iFace->mColors[0] = paVar36;
        paVar36 = _iFace->mColors[0];
        pvVar31 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                            (&mesh->mVertexColors,0);
        sVar15 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                           (&mesh->mVertexColors);
        memcpy(paVar36,pvVar31,sVar15 << 4);
      }
      for (avBonesOut.
           super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          (uint)avBonesOut.
                super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage < _iFace->mNumFaces;
          avBonesOut.
          super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (uint)avBonesOut.
                     super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
        _iFace->mFaces
        [(uint)avBonesOut.
               super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage].mNumIndices = 3;
        puVar37 = (uint *)operator_new__(0xc);
        _iFace->mFaces
        [(uint)avBonesOut.
               super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage].mIndices = puVar37;
        pvVar20 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::operator[]
                            (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,
                             (ulong)(uint)avBonesOut.
                                          super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        *_iFace->mFaces
         [(uint)avBonesOut.
                super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage].mIndices =
             (pvVar20->super_FaceWithSmoothingGroup).mIndices[0];
        pvVar20 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::operator[]
                            (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,
                             (ulong)(uint)avBonesOut.
                                          super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        _iFace->mFaces
        [(uint)avBonesOut.
               super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage].mIndices[1] =
             (pvVar20->super_FaceWithSmoothingGroup).mIndices[1];
        pvVar20 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::operator[]
                            (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,
                             (ulong)(uint)avBonesOut.
                                          super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        _iFace->mFaces
        [(uint)avBonesOut.
               super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage].mIndices[2] =
             (pvVar20->super_FaceWithSmoothingGroup).mIndices[2];
      }
      bVar14 = std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::empty
                         (&mesh->mBones);
      if ((!bVar14) &&
         (bVar14 = std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::
                   empty(&mesh->mBoneVertices), !bVar14)) {
        sVar15 = std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::size
                           (&mesh->mBones);
        this_00 = (allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *)
                  ((long)&harrypotter._M_current + 7);
        std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>::allocator
                  (this_00);
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                  *)&quak,sVar15,this_00);
        std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>::~allocator
                  ((allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *)
                   ((long)&harrypotter._M_current + 7));
        harrypotter._M_current._0_4_ = 0;
        local_120._M_current =
             (BoneVertex *)
             std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::begin
                       (&mesh->mBoneVertices);
        __gnu_cxx::
        __normal_iterator<Assimp::ASE::BoneVertex_const*,std::vector<Assimp::ASE::BoneVertex,std::allocator<Assimp::ASE::BoneVertex>>>
        ::__normal_iterator<Assimp::ASE::BoneVertex*>
                  ((__normal_iterator<Assimp::ASE::BoneVertex_const*,std::vector<Assimp::ASE::BoneVertex,std::allocator<Assimp::ASE::BoneVertex>>>
                    *)&local_118,&local_120);
        while( true ) {
          ronaldweasley._M_current =
               (pair<int,_float> *)
               std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::end
                         (&mesh->mBoneVertices);
          bVar14 = __gnu_cxx::operator!=
                             (&local_118,
                              (__normal_iterator<Assimp::ASE::BoneVertex_*,_std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>_>
                               *)&ronaldweasley);
          if (!bVar14) break;
          pBVar38 = __gnu_cxx::
                    __normal_iterator<const_Assimp::ASE::BoneVertex_*,_std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>_>
                    ::operator*(&local_118);
          local_130._M_current =
               (pair<int,_float> *)
               std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::begin
                         (&pBVar38->mBoneWeights);
          while( true ) {
            pBVar38 = __gnu_cxx::
                      __normal_iterator<const_Assimp::ASE::BoneVertex_*,_std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>_>
                      ::operator*(&local_118);
            weight = (aiVertexWeight)
                     std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                     end(&pBVar38->mBoneWeights);
            bVar14 = __gnu_cxx::operator!=
                               (&local_130,
                                (__normal_iterator<const_std::pair<int,_float>_*,_std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>_>
                                 *)&weight);
            if (!bVar14) break;
            aiVertexWeight::aiVertexWeight((aiVertexWeight *)&stack0xfffffffffffffec0);
            local_140 = (uint)harrypotter._M_current;
            ppVar29 = __gnu_cxx::
                      __normal_iterator<const_std::pair<int,_float>_*,_std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>_>
                      ::operator*(&local_130);
            jfkennedy = (uint)ppVar29->second;
            ppVar29 = __gnu_cxx::
                      __normal_iterator<const_std::pair<int,_float>_*,_std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>_>
                      ::operator*(&local_130);
            pvVar39 = std::
                      vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                      ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                    *)&quak,(long)ppVar29->first);
            std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                      (pvVar39,(aiVertexWeight *)&stack0xfffffffffffffec0);
            __gnu_cxx::
            __normal_iterator<const_std::pair<int,_float>_*,_std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>_>
            ::operator++(&local_130);
          }
          __gnu_cxx::
          __normal_iterator<const_Assimp::ASE::BoneVertex_*,_std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>_>
          ::operator++(&local_118);
          harrypotter._M_current._0_4_ = (uint)harrypotter._M_current + 1;
        }
        _iFace->mNumBones = 0;
        for (pcBone_1._4_4_ = 0;
            sVar15 = std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::size
                               (&mesh->mBones), pcBone_1._4_4_ < sVar15;
            pcBone_1._4_4_ = pcBone_1._4_4_ + 1) {
          pvVar39 = std::
                    vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                  *)&quak,(ulong)pcBone_1._4_4_);
          bVar14 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::empty(pvVar39);
          if (!bVar14) {
            _iFace->mNumBones = _iFace->mNumBones + 1;
          }
        }
        ppaVar40 = (aiBone **)operator_new__((ulong)_iFace->mNumBones << 3);
        _iFace->mBones = ppaVar40;
        ppaStack_150 = _iFace->mBones;
        for (pc_1._4_4_ = 0;
            sVar15 = std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::size
                               (&mesh->mBones), pc_1._4_4_ < sVar15; pc_1._4_4_ = pc_1._4_4_ + 1) {
          pvVar39 = std::
                    vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                  *)&quak,(ulong)pc_1._4_4_);
          bVar14 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::empty(pvVar39);
          if (!bVar14) {
            this_03 = (aiBone *)operator_new(0x450);
            aiBone::aiBone(this_03);
            *ppaStack_150 = this_03;
            psVar33 = &std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::
                       operator[](&mesh->mBones,(ulong)pc_1._4_4_)->mName;
            aiString::Set((aiString *)this_03,psVar33);
            pvVar39 = std::
                      vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                      ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                    *)&quak,(ulong)pc_1._4_4_);
            sVar15 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size(pvVar39);
            this_03->mNumWeights = (uint)sVar15;
            uVar18 = (ulong)this_03->mNumWeights;
            paVar34 = (aiVertexWeight *)operator_new__(uVar18 << 3);
            if (uVar18 != 0) {
              local_540 = paVar34;
              do {
                aiVertexWeight::aiVertexWeight(local_540);
                local_540 = local_540 + 1;
              } while (local_540 != paVar34 + uVar18);
            }
            this_03->mWeights = paVar34;
            paVar34 = this_03->mWeights;
            pvVar39 = std::
                      vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                      ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                    *)&quak,(ulong)pc_1._4_4_);
            __src = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::operator[]
                              (pvVar39,0);
            memcpy(paVar34,__src,(ulong)this_03->mNumWeights << 3);
            ppaStack_150 = ppaStack_150 + 1;
          }
        }
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                   *)&quak);
      }
    }
  }
  else {
    pvVar17 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::operator[]
                        (&this->mParser->m_vMaterials,(ulong)mesh->iMaterialIndex);
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::vector
              ((vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *)&aiSplit,
               &pvVar17->avSubMaterials);
    sVar15 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::size
                       ((vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *)
                        &aiSplit);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sVar15;
    uVar18 = SUB168(auVar3 * ZEXT816(0x18),0);
    uVar43 = uVar18 + 8;
    if (0xfffffffffffffff7 < uVar18) {
      uVar43 = 0xffffffffffffffff;
    }
    if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
      uVar43 = 0xffffffffffffffff;
    }
    psVar19 = (size_type *)operator_new__(uVar43);
    *psVar19 = sVar15;
    local_40 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(psVar19 + 1);
    if (sVar15 != 0) {
      local_1a0 = local_40;
      do {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(local_1a0);
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != local_40 + sVar15);
    }
    for (local_50 = 0; uVar18 = (ulong)local_50,
        sVar15 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::size
                           (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces),
        uVar18 < sVar15; local_50 = local_50 + 1) {
      pvVar20 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::operator[]
                          (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,
                           (ulong)local_50);
      uVar1 = pvVar20->iMaterial;
      sVar15 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::size
                         ((vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *)
                          &aiSplit);
      pvVar13 = local_40;
      if (uVar1 < sVar15) {
        pvVar20 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::operator[]
                            (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,
                             (ulong)local_50);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (pvVar13 + pvVar20->iMaterial,&local_50);
      }
      else {
        pLVar16 = DefaultLogger::get();
        Logger::warn(pLVar16,"Submaterial index is out of range");
        pvVar13 = local_40;
        sVar15 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::size
                           ((vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *
                            )&aiSplit);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (pvVar13 + (sVar15 - 1),&local_50);
      }
    }
    for (p_pcOut._4_4_ = 0; uVar18 = (ulong)p_pcOut._4_4_,
        sVar15 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::size
                           ((vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *
                            )&aiSplit), pvVar13 = local_40, uVar18 < sVar15;
        p_pcOut._4_4_ = p_pcOut._4_4_ + 1) {
      bVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                         (local_40 + p_pcOut._4_4_);
      if (!bVar14) {
        paVar21 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(paVar21);
        paVar21->mPrimitiveTypes = 4;
        paVar21->mMaterialIndex = p_pcOut._4_4_;
        avOutputBones =
             (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              *)paVar21;
        pvVar17 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::
                  operator[](&this->mParser->m_vMaterials,(ulong)mesh->iMaterialIndex);
        pvVar17 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::
                  operator[](&pvVar17->avSubMaterials,(ulong)p_pcOut._4_4_);
        pvVar17->bNeed = true;
        avOutputBones[3].
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)mesh->iMaterialIndex;
        avOutputBones[2].
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)mesh;
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                  ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                   vSubMaterials.
                   super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&avOutputBones);
        sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           (local_40 + p_pcOut._4_4_);
        *(int *)((long)&(avOutputBones->
                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 4) = (int)sVar15 * 3;
        sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           (local_40 + p_pcOut._4_4_);
        *(int *)&(avOutputBones->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish = (int)sVar15;
        _iIndex = (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   *)0x0;
        bVar14 = std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::empty
                           (&mesh->mBones);
        pvVar41 = _iIndex;
        if (!bVar14) {
          sVar15 = std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::size
                             (&mesh->mBones);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = sVar15;
          uVar18 = SUB168(auVar4 * ZEXT816(0x18),0);
          uVar43 = uVar18 + 8;
          if (0xfffffffffffffff7 < uVar18) {
            uVar43 = 0xffffffffffffffff;
          }
          if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
            uVar43 = 0xffffffffffffffff;
          }
          psVar19 = (size_type *)operator_new__(uVar43);
          *psVar19 = sVar15;
          pvVar41 = (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     *)(psVar19 + 1);
          if (sVar15 != 0) {
            local_210 = pvVar41;
            do {
              std::
              vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ::vector(local_210);
              local_210 = local_210 + 1;
            } while (local_210 != pvVar41 + sVar15);
          }
        }
        _iIndex = pvVar41;
        uVar18 = (ulong)*(uint *)&(avOutputBones->
                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish;
        puVar22 = (ulong *)operator_new__(uVar18 << 4 | 8);
        *puVar22 = uVar18;
        paVar42 = (aiFace *)(puVar22 + 1);
        if (uVar18 != 0) {
          local_240 = paVar42;
          do {
            aiFace::aiFace(local_240);
            local_240 = local_240 + 1;
          } while (local_240 != paVar42 + uVar18);
        }
        avOutputBones[8].
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar42;
        q = 0;
        if (*(int *)((long)&(avOutputBones->
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 4) != 0) {
          uVar18 = (ulong)*(uint *)((long)&(avOutputBones->
                                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 4);
          paVar23 = (aiVector3t<float> *)operator_new__(uVar18 * 0xc);
          if (uVar18 != 0) {
            local_268 = paVar23;
            do {
              aiVector3t<float>::aiVector3t(local_268);
              local_268 = local_268 + 1;
            } while (local_268 != paVar23 + uVar18);
          }
          (avOutputBones->
          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar23;
          uVar18 = (ulong)*(uint *)((long)&(avOutputBones->
                                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 4);
          paVar23 = (aiVector3t<float> *)operator_new__(uVar18 * 0xc);
          if (uVar18 != 0) {
            local_290 = paVar23;
            do {
              aiVector3t<float>::aiVector3t(local_290);
              local_290 = local_290 + 1;
            } while (local_290 != paVar23 + uVar18);
          }
          avOutputBones[1].
          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar23;
          for (iIndex2 = 0;
              sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                 (local_40 + p_pcOut._4_4_), iIndex2 < sVar15; iIndex2 = iIndex2 + 1
              ) {
            pvVar24 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (local_40 + p_pcOut._4_4_,(ulong)iIndex2);
            uVar1 = *pvVar24;
            pVar25 = (pair<unsigned_int,_float>)operator_new__(0xc);
            avOutputBones[8].
            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage[(ulong)iIndex2 * 2 + 1] = pVar25;
            avOutputBones[8].
            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage[(ulong)iIndex2 * 2].first = 3;
            for (local_78 = 0; local_78 < 3; local_78 = local_78 + 1) {
              pvVar20 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::
                        operator[](&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,
                                   (ulong)uVar1);
              blubb._M_current._4_4_ = (pvVar20->super_FaceWithSmoothingGroup).mIndices[local_78];
              pvVar26 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                        operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *
                                   )mesh,(ulong)blubb._M_current._4_4_);
              puVar27 = (undefined8 *)
                        ((long)(avOutputBones->
                               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                               )._M_impl.super__Vector_impl_data._M_end_of_storage + (ulong)q * 0xc)
              ;
              *puVar27 = *(undefined8 *)pvVar26;
              *(float *)(puVar27 + 1) = pvVar26->z;
              pvVar26 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                        operator[](&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).
                                    mNormals,(ulong)blubb._M_current._4_4_);
              puVar27 = (undefined8 *)
                        ((long)avOutputBones[1].
                               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + (ulong)q * 0xc);
              *puVar27 = *(undefined8 *)pvVar26;
              *(float *)(puVar27 + 1) = pvVar26->z;
              bVar14 = std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::empty
                                 (&mesh->mBones);
              if (!bVar14) {
                if (_iIndex ==
                    (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     *)0x0) {
                  __assert_fail("avOutputBones",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASELoader.cpp"
                                ,0x400,
                                "void Assimp::ASEImporter::ConvertMeshes(ASE::Mesh &, std::vector<aiMesh *> &)"
                               );
                }
                uVar18 = (ulong)blubb._M_current._4_4_;
                sVar15 = std::
                         vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::
                         size(&mesh->mBoneVertices);
                if (uVar18 < sVar15) {
                  pvVar28 = std::
                            vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                            ::operator[](&mesh->mBoneVertices,(ulong)blubb._M_current._4_4_);
                  local_90._M_current =
                       (pair<int,_float> *)
                       std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                       begin(&pvVar28->mBoneWeights);
                  __gnu_cxx::
                  __normal_iterator<std::pair<int,float>const*,std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>>
                  ::__normal_iterator<std::pair<int,float>*>
                            ((__normal_iterator<std::pair<int,float>const*,std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>>
                              *)&local_88,&local_90);
                  while( true ) {
                    pvVar28 = std::
                              vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                              ::operator[](&mesh->mBoneVertices,(ulong)blubb._M_current._4_4_);
                    local_98._M_current =
                         (pair<int,_float> *)
                         std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                         ::end(&pvVar28->mBoneWeights);
                    bVar14 = __gnu_cxx::operator!=(&local_88,&local_98);
                    pvVar41 = _iIndex;
                    if (!bVar14) break;
                    ppVar29 = __gnu_cxx::
                              __normal_iterator<const_std::pair<int,_float>_*,_std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>_>
                              ::operator*(&local_88);
                    iVar2 = ppVar29->first;
                    ppVar29 = __gnu_cxx::
                              __normal_iterator<const_std::pair<int,_float>_*,_std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>_>
                              ::operator*(&local_88);
                    std::pair<unsigned_int,_float>::pair<unsigned_int_&,_true>
                              ((pair<unsigned_int,_float> *)&q_1,&q,&ppVar29->second);
                    std::
                    vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    ::push_back(pvVar41 + iVar2,(value_type *)&q_1);
                    __gnu_cxx::
                    __normal_iterator<const_std::pair<int,_float>_*,_std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>_>
                    ::operator++(&local_88);
                  }
                }
              }
              *(uint *)((long)avOutputBones[8].
                              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage
                              [(ulong)iIndex2 * 2 + 1] + (ulong)local_78 * 4) = q;
              q = q + 1;
            }
          }
        }
        for (t_1 = 0; t_1 < 8; t_1 = t_1 + 1) {
          bVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                             (mesh->amTexCoords + t_1);
          if (!bVar14) {
            uVar18 = (ulong)*(uint *)((long)&(avOutputBones->
                                             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 4);
            paVar23 = (aiVector3t<float> *)operator_new__(uVar18 * 0xc);
            if (uVar18 != 0) {
              local_2e8 = paVar23;
              do {
                aiVector3t<float>::aiVector3t(local_2e8);
                local_2e8 = local_2e8 + 1;
              } while (local_2e8 != paVar23 + uVar18);
            }
            (&avOutputBones[4].
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)[t_1] = (pointer)paVar23;
            q = 0;
            for (q_2 = 0; uVar18 = (ulong)q_2,
                sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                   (local_40 + p_pcOut._4_4_), uVar18 < sVar15; q_2 = q_2 + 1) {
              pvVar24 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (local_40 + p_pcOut._4_4_,(ulong)q_2);
              uVar1 = *pvVar24;
              for (t_2 = 0; t_2 < 3; t_2 = t_2 + 1) {
                uVar18 = (ulong)t_1;
                pvVar20 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::
                          operator[](&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).
                                      mFaces,(ulong)uVar1);
                pvVar26 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                          operator[](mesh->amTexCoords + uVar18,
                                     (ulong)(pvVar20->super_FaceWithSmoothingGroup).mIndices[t_2]);
                puVar27 = (undefined8 *)
                          ((long)(&avOutputBones[4].
                                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)[t_1] +
                          (ulong)q * 0xc);
                *puVar27 = *(undefined8 *)pvVar26;
                *(float *)(puVar27 + 1) = pvVar26->z;
                q = q + 1;
              }
            }
            *(uint *)((long)&avOutputBones[7].
                             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + (ulong)t_1 * 4) =
                 mesh->mNumUVComponents[t_1];
          }
        }
        bVar14 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::empty
                           (&mesh->mVertexColors);
        if (!bVar14) {
          uVar18 = (ulong)*(uint *)((long)&(avOutputBones->
                                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 4);
          paVar30 = (aiColor4t<float> *)operator_new__(uVar18 << 4);
          if (uVar18 != 0) {
            local_320 = paVar30;
            do {
              aiColor4t<float>::aiColor4t(local_320);
              local_320 = local_320 + 1;
            } while (local_320 != paVar30 + uVar18);
          }
          avOutputBones[2].
          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar30;
          q = 0;
          for (mrspock = 0; uVar18 = (ulong)mrspock,
              sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                 (local_40 + p_pcOut._4_4_), uVar18 < sVar15; mrspock = mrspock + 1)
          {
            pvVar24 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (local_40 + p_pcOut._4_4_,(ulong)mrspock);
            uVar1 = *pvVar24;
            for (pcBone._4_4_ = 0; pcBone._4_4_ < 3; pcBone._4_4_ = pcBone._4_4_ + 1) {
              pvVar20 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::
                        operator[](&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,
                                   (ulong)uVar1);
              pvVar31 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::
                        operator[](&mesh->mVertexColors,
                                   (ulong)(pvVar20->super_FaceWithSmoothingGroup).mIndices
                                          [pcBone._4_4_]);
              ppVar32 = avOutputBones[2].
                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (ulong)q * 2;
              fVar12 = pvVar31->g;
              ppVar32->first = (uint)pvVar31->r;
              ppVar32->second = fVar12;
              fVar12 = pvVar31->a;
              ppVar32[1].first = (uint)pvVar31->b;
              ppVar32[1].second = fVar12;
              q = q + 1;
            }
          }
        }
        bVar14 = std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::empty
                           (&mesh->mBones);
        if (!bVar14) {
          *(undefined4 *)
           &avOutputBones[9].
            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ._M_impl.super__Vector_impl_data._M_start = 0;
          for (pcBone._0_4_ = 0; uVar18 = (ulong)(uint)pcBone,
              sVar15 = std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::size
                                 (&mesh->mBones), uVar18 < sVar15; pcBone._0_4_ = (uint)pcBone + 1)
          {
            bVar14 = std::
                     vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     ::empty(_iIndex + (uint)pcBone);
            if (!bVar14) {
              *(int *)&avOutputBones[9].
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&avOutputBones[9].
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          ppVar32 = (pointer)operator_new__((ulong)*(uint *)&avOutputBones[9].
                                                                                                                          
                                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start << 3);
          avOutputBones[9].
          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar32;
          ppStack_c0 = avOutputBones[9].
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          for (pc._4_4_ = 0; uVar18 = (ulong)pc._4_4_,
              sVar15 = std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::size
                                 (&mesh->mBones), pvVar41 = _iIndex, uVar18 < sVar15;
              pc._4_4_ = pc._4_4_ + 1) {
            bVar14 = std::
                     vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     ::empty(_iIndex + pc._4_4_);
            if (!bVar14) {
              pVar25 = (pair<unsigned_int,_float>)operator_new(0x450);
              aiBone::aiBone((aiBone *)pVar25);
              *ppStack_c0 = pVar25;
              pStack_d0 = pVar25;
              psVar33 = &std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::
                         operator[](&mesh->mBones,(ulong)pc._4_4_)->mName;
              aiString::Set((aiString *)pVar25,psVar33);
              sVar15 = std::
                       vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       ::size(_iIndex + pc._4_4_);
              *(uint *)((long)pStack_d0 + 0x404) = (uint)sVar15;
              uVar18 = (ulong)*(uint *)((long)pStack_d0 + 0x404);
              paVar34 = (aiVertexWeight *)operator_new__(uVar18 << 3);
              if (uVar18 != 0) {
                local_380 = paVar34;
                do {
                  aiVertexWeight::aiVertexWeight(local_380);
                  local_380 = local_380 + 1;
                } while (local_380 != paVar34 + uVar18);
              }
              *(aiVertexWeight **)((long)pStack_d0 + 0x408) = paVar34;
              for (ref._4_4_ = 0; ref._4_4_ < *(uint *)((long)pStack_d0 + 0x404);
                  ref._4_4_ = ref._4_4_ + 1) {
                p_pcOut_1 = (aiMesh *)
                            std::
                            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ::operator[](_iIndex + pc._4_4_,(ulong)ref._4_4_);
                (*(aiVertexWeight **)((long)pStack_d0 + 0x408))[ref._4_4_].mVertexId =
                     p_pcOut_1->mPrimitiveTypes;
                (*(aiVertexWeight **)((long)pStack_d0 + 0x408))[ref._4_4_].mWeight =
                     (float)p_pcOut_1->mNumVertices;
              }
              ppStack_c0 = ppStack_c0 + 1;
            }
          }
          if (_iIndex !=
              (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               *)0x0) {
            pvVar10 = _iIndex + -1;
            this_01 = _iIndex + (long)_iIndex[-1].
                                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            while (pvVar41 != this_01) {
              this_01 = this_01 + -1;
              std::
              vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ::~vector(this_01);
            }
            operator_delete__(&(pvVar10->
                               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                               )._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
        }
      }
    }
    if (local_40 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      pvVar11 = local_40 + -1;
      this_02 = local_40 +
                (long)local_40[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
      while (pvVar13 != this_02) {
        this_02 = this_02 + -1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_02);
      }
      operator_delete__(&(pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::~vector
              ((vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *)&aiSplit);
  }
  return;
}

Assistant:

void ASEImporter::ConvertMeshes(ASE::Mesh& mesh, std::vector<aiMesh*>& avOutMeshes)
{
    // validate the material index of the mesh
    if (mesh.iMaterialIndex >= mParser->m_vMaterials.size())    {
        mesh.iMaterialIndex = (unsigned int)mParser->m_vMaterials.size()-1;
        ASSIMP_LOG_WARN("Material index is out of range");
    }

    // If the material the mesh is assigned to is consisting of submeshes, split it
    if (!mParser->m_vMaterials[mesh.iMaterialIndex].avSubMaterials.empty()) {
        std::vector<ASE::Material> vSubMaterials = mParser->
            m_vMaterials[mesh.iMaterialIndex].avSubMaterials;

        std::vector<unsigned int>* aiSplit = new std::vector<unsigned int>[vSubMaterials.size()];

        // build a list of all faces per sub-material
        for (unsigned int i = 0; i < mesh.mFaces.size();++i)    {
            // check range
            if (mesh.mFaces[i].iMaterial >= vSubMaterials.size()) {
                ASSIMP_LOG_WARN("Submaterial index is out of range");

                // use the last material instead
                aiSplit[vSubMaterials.size()-1].push_back(i);
            }
            else aiSplit[mesh.mFaces[i].iMaterial].push_back(i);
        }

        // now generate submeshes
        for (unsigned int p = 0; p < vSubMaterials.size();++p)  {
            if (!aiSplit[p].empty())    {

                aiMesh* p_pcOut = new aiMesh();
                p_pcOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

                // let the sub material index
                p_pcOut->mMaterialIndex = p;

                // we will need this material
                mParser->m_vMaterials[mesh.iMaterialIndex].avSubMaterials[p].bNeed = true;

                // store the real index here ... color channel 3
                p_pcOut->mColors[3] = (aiColor4D*)(uintptr_t)mesh.iMaterialIndex;

                // store a pointer to the mesh in color channel 2
                p_pcOut->mColors[2] = (aiColor4D*) &mesh;
                avOutMeshes.push_back(p_pcOut);

                // convert vertices
                p_pcOut->mNumVertices = (unsigned int)aiSplit[p].size()*3;
                p_pcOut->mNumFaces = (unsigned int)aiSplit[p].size();

                // receive output vertex weights
                std::vector<std::pair<unsigned int, float> > *avOutputBones = NULL;
                if (!mesh.mBones.empty())   {
                    avOutputBones = new std::vector<std::pair<unsigned int, float> >[mesh.mBones.size()];
                }

                // allocate enough storage for faces
                p_pcOut->mFaces = new aiFace[p_pcOut->mNumFaces];

                unsigned int iBase = 0,iIndex;
                if (p_pcOut->mNumVertices)  {
                    p_pcOut->mVertices = new aiVector3D[p_pcOut->mNumVertices];
                    p_pcOut->mNormals  = new aiVector3D[p_pcOut->mNumVertices];
                    for (unsigned int q = 0; q < aiSplit[p].size();++q) {

                        iIndex = aiSplit[p][q];

                        p_pcOut->mFaces[q].mIndices = new unsigned int[3];
                        p_pcOut->mFaces[q].mNumIndices = 3;

                        for (unsigned int t = 0; t < 3;++t, ++iBase)    {
                            const uint32_t iIndex2 = mesh.mFaces[iIndex].mIndices[t];

                            p_pcOut->mVertices[iBase] = mesh.mPositions [iIndex2];
                            p_pcOut->mNormals [iBase] = mesh.mNormals   [iIndex2];

                            // convert bones, if existing
                            if (!mesh.mBones.empty()) {
                                ai_assert(avOutputBones);
                                // check whether there is a vertex weight for this vertex index
                                if (iIndex2 < mesh.mBoneVertices.size())    {

                                    for (std::vector<std::pair<int,float> >::const_iterator
                                        blubb =  mesh.mBoneVertices[iIndex2].mBoneWeights.begin();
                                        blubb != mesh.mBoneVertices[iIndex2].mBoneWeights.end();++blubb)    {

                                        // NOTE: illegal cases have already been filtered out
                                        avOutputBones[(*blubb).first].push_back(std::pair<unsigned int, float>(
                                            iBase,(*blubb).second));
                                    }
                                }
                            }
                            p_pcOut->mFaces[q].mIndices[t] = iBase;
                        }
                    }
                }
                // convert texture coordinates (up to AI_MAX_NUMBER_OF_TEXTURECOORDS sets supported)
                for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                    if (!mesh.amTexCoords[c].empty())
                    {
                        p_pcOut->mTextureCoords[c] = new aiVector3D[p_pcOut->mNumVertices];
                        iBase = 0;
                        for (unsigned int q = 0; q < aiSplit[p].size();++q) {
                            iIndex = aiSplit[p][q];
                            for (unsigned int t = 0; t < 3;++t) {
                                p_pcOut->mTextureCoords[c][iBase++] = mesh.amTexCoords[c][mesh.mFaces[iIndex].mIndices[t]];
                            }
                        }
                        // Setup the number of valid vertex components
                        p_pcOut->mNumUVComponents[c] = mesh.mNumUVComponents[c];
                    }
                }

                // Convert vertex colors (only one set supported)
                if (!mesh.mVertexColors.empty()){
                    p_pcOut->mColors[0] = new aiColor4D[p_pcOut->mNumVertices];
                    iBase = 0;
                    for (unsigned int q = 0; q < aiSplit[p].size();++q) {
                        iIndex = aiSplit[p][q];
                        for (unsigned int t = 0; t < 3;++t) {
                            p_pcOut->mColors[0][iBase++] = mesh.mVertexColors[mesh.mFaces[iIndex].mIndices[t]];
                        }
                    }
                }
                // Copy bones
                if (!mesh.mBones.empty())   {
                    p_pcOut->mNumBones = 0;
                    for (unsigned int mrspock = 0; mrspock < mesh.mBones.size();++mrspock)
                        if (!avOutputBones[mrspock].empty())p_pcOut->mNumBones++;

                    p_pcOut->mBones = new aiBone* [ p_pcOut->mNumBones ];
                    aiBone** pcBone = p_pcOut->mBones;
                    for (unsigned int mrspock = 0; mrspock < mesh.mBones.size();++mrspock)
                    {
                        if (!avOutputBones[mrspock].empty())    {
                            // we will need this bone. add it to the output mesh and
                            // add all per-vertex weights
                            aiBone* pc = *pcBone = new aiBone();
                            pc->mName.Set(mesh.mBones[mrspock].mName);

                            pc->mNumWeights = (unsigned int)avOutputBones[mrspock].size();
                            pc->mWeights = new aiVertexWeight[pc->mNumWeights];

                            for (unsigned int captainkirk = 0; captainkirk < pc->mNumWeights;++captainkirk)
                            {
                                const std::pair<unsigned int,float>& ref = avOutputBones[mrspock][captainkirk];
                                pc->mWeights[captainkirk].mVertexId = ref.first;
                                pc->mWeights[captainkirk].mWeight = ref.second;
                            }
                            ++pcBone;
                        }
                    }
                    // delete allocated storage
                    delete[] avOutputBones;
                }
            }
        }
        // delete storage
        delete[] aiSplit;
    }
    else
    {
        // Otherwise we can simply copy the data to one output mesh
        // This codepath needs less memory and uses fast memcpy()s
        // to do the actual copying. So I think it is worth the
        // effort here.

        aiMesh* p_pcOut = new aiMesh();
        p_pcOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        // set an empty sub material index
        p_pcOut->mMaterialIndex = ASE::Face::DEFAULT_MATINDEX;
        mParser->m_vMaterials[mesh.iMaterialIndex].bNeed = true;

        // store the real index here ... in color channel 3
        p_pcOut->mColors[3] = (aiColor4D*)(uintptr_t)mesh.iMaterialIndex;

        // store a pointer to the mesh in color channel 2
        p_pcOut->mColors[2] = (aiColor4D*) &mesh;
        avOutMeshes.push_back(p_pcOut);

        // If the mesh hasn't faces or vertices, there are two cases
        // possible: 1. the model is invalid. 2. This is a dummy
        // helper object which we are going to remove later ...
        if (mesh.mFaces.empty() || mesh.mPositions.empty()) {
            return;
        }

        // convert vertices
        p_pcOut->mNumVertices = (unsigned int)mesh.mPositions.size();
        p_pcOut->mNumFaces = (unsigned int)mesh.mFaces.size();

        // allocate enough storage for faces
        p_pcOut->mFaces = new aiFace[p_pcOut->mNumFaces];

        // copy vertices
        p_pcOut->mVertices = new aiVector3D[mesh.mPositions.size()];
        memcpy(p_pcOut->mVertices,&mesh.mPositions[0],
            mesh.mPositions.size() * sizeof(aiVector3D));

        // copy normals
        p_pcOut->mNormals = new aiVector3D[mesh.mNormals.size()];
        memcpy(p_pcOut->mNormals,&mesh.mNormals[0],
            mesh.mNormals.size() * sizeof(aiVector3D));

        // copy texture coordinates
        for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c)    {
            if (!mesh.amTexCoords[c].empty())   {
                p_pcOut->mTextureCoords[c] = new aiVector3D[mesh.amTexCoords[c].size()];
                memcpy(p_pcOut->mTextureCoords[c],&mesh.amTexCoords[c][0],
                    mesh.amTexCoords[c].size() * sizeof(aiVector3D));

                // setup the number of valid vertex components
                p_pcOut->mNumUVComponents[c] = mesh.mNumUVComponents[c];
            }
        }

        // copy vertex colors
        if (!mesh.mVertexColors.empty())    {
            p_pcOut->mColors[0] = new aiColor4D[mesh.mVertexColors.size()];
            memcpy(p_pcOut->mColors[0],&mesh.mVertexColors[0],
                mesh.mVertexColors.size() * sizeof(aiColor4D));
        }

        // copy faces
        for (unsigned int iFace = 0; iFace < p_pcOut->mNumFaces;++iFace)    {
            p_pcOut->mFaces[iFace].mNumIndices = 3;
            p_pcOut->mFaces[iFace].mIndices = new unsigned int[3];

            // copy indices
            p_pcOut->mFaces[iFace].mIndices[0] = mesh.mFaces[iFace].mIndices[0];
            p_pcOut->mFaces[iFace].mIndices[1] = mesh.mFaces[iFace].mIndices[1];
            p_pcOut->mFaces[iFace].mIndices[2] = mesh.mFaces[iFace].mIndices[2];
        }

        // copy vertex bones
        if (!mesh.mBones.empty() && !mesh.mBoneVertices.empty())    {
            std::vector<std::vector<aiVertexWeight> > avBonesOut( mesh.mBones.size() );

            // find all vertex weights for this bone
            unsigned int quak = 0;
            for (std::vector<BoneVertex>::const_iterator harrypotter =  mesh.mBoneVertices.begin();
                harrypotter != mesh.mBoneVertices.end();++harrypotter,++quak)   {

                for (std::vector<std::pair<int,float> >::const_iterator
                    ronaldweasley  = (*harrypotter).mBoneWeights.begin();
                    ronaldweasley != (*harrypotter).mBoneWeights.end();++ronaldweasley)
                {
                    aiVertexWeight weight;
                    weight.mVertexId = quak;
                    weight.mWeight = (*ronaldweasley).second;
                    avBonesOut[(*ronaldweasley).first].push_back(weight);
                }
            }

            // now build a final bone list
            p_pcOut->mNumBones = 0;
            for (unsigned int jfkennedy = 0; jfkennedy < mesh.mBones.size();++jfkennedy)
                if (!avBonesOut[jfkennedy].empty())p_pcOut->mNumBones++;

            p_pcOut->mBones = new aiBone*[p_pcOut->mNumBones];
            aiBone** pcBone = p_pcOut->mBones;
            for (unsigned int jfkennedy = 0; jfkennedy < mesh.mBones.size();++jfkennedy)    {
                if (!avBonesOut[jfkennedy].empty()) {
                    aiBone* pc = *pcBone = new aiBone();
                    pc->mName.Set(mesh.mBones[jfkennedy].mName);
                    pc->mNumWeights = (unsigned int)avBonesOut[jfkennedy].size();
                    pc->mWeights = new aiVertexWeight[pc->mNumWeights];
                    ::memcpy(pc->mWeights,&avBonesOut[jfkennedy][0],
                        sizeof(aiVertexWeight) * pc->mNumWeights);
                    ++pcBone;
                }
            }
        }
    }
}